

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

void __thiscall QTextDocument::setHtml(QTextDocument *this,QString *html)

{
  bool enable;
  int iVar1;
  QTextDocumentPrivate *this_00;
  long in_FS_OFFSET;
  QTextHtmlImporter QStack_128;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextDocumentPrivate **)&this->field_0x8;
  enable = this_00->undoEnabled;
  QTextDocumentPrivate::enableUndoRedo(this_00,false);
  iVar1 = this_00->editBlock;
  this_00->editBlock = iVar1 + 1;
  if (iVar1 == 0) {
    this_00->revision = this_00->revision + 1;
  }
  QTextDocumentPrivate::clear(this_00);
  QTextHtmlImporter::QTextHtmlImporter(&QStack_128,this,html,ImportToDocument,(QTextDocument *)0x0);
  QTextHtmlImporter::import(&QStack_128);
  QTextCursor::~QTextCursor(&QStack_128.cursor);
  QArrayDataPointer<QTextHtmlImporter::Table>::~QArrayDataPointer(&QStack_128.tables.d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_128.namedAnchors.d);
  QArrayDataPointer<QTextHtmlImporter::List>::~QArrayDataPointer(&QStack_128.lists.d);
  QTextHtmlParser::~QTextHtmlParser(&QStack_128.super_QTextHtmlParser);
  QTextDocumentPrivate::endEditBlock(this_00);
  QTextDocumentPrivate::enableUndoRedo(this_00,enable);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::setHtml(const QString &html)
{
    Q_D(QTextDocument);
    bool previousState = d->isUndoRedoEnabled();
    d->enableUndoRedo(false);
    d->beginEditBlock();
    d->clear();
    // ctor calls parse() to build up QTextHtmlParser::nodes list
    // then import() populates the QTextDocument from those
    QTextHtmlImporter(this, html, QTextHtmlImporter::ImportToDocument).import();
    d->endEditBlock();
    d->enableUndoRedo(previousState);
}